

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdial.cpp
# Opt level: O3

void __thiscall QDial::mousePressEvent(QDial *this,QMouseEvent *e)

{
  QDialPrivate *this_00;
  bool bVar1;
  int position;
  long in_FS_OFFSET;
  double dVar2;
  undefined1 auVar3 [16];
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  if ((((this_00->super_QAbstractSliderPrivate).maximum ==
        *(int *)&(this_00->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254) ||
      (*(int *)(e + 0x40) != 1)) || (*(int *)(e + 0x44) != 1)) {
    e[0xc] = (QMouseEvent)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else {
    e[0xc] = (QMouseEvent)0x1;
    auVar3 = QEventPoint::position();
    dVar2 = (double)((ulong)auVar3._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar3._0_8_;
    bVar1 = 2147483647.0 < dVar2;
    if (dVar2 <= -2147483648.0) {
      dVar2 = -2147483648.0;
    }
    local_20.xp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
    dVar2 = (double)((ulong)auVar3._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar3._8_8_;
    bVar1 = 2147483647.0 < dVar2;
    if (dVar2 <= -2147483648.0) {
      dVar2 = -2147483648.0;
    }
    local_20.yp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
    position = QDialPrivate::valueFromPoint(this_00,&local_20);
    QAbstractSlider::setSliderPosition(&this->super_QAbstractSlider,position);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QAbstractSlider::setSliderDown(&this->super_QAbstractSlider,true);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QDial::mousePressEvent(QMouseEvent *e)
{
    Q_D(QDial);
    if (d->maximum == d->minimum ||
        (e->button() != Qt::LeftButton)  ||
        (e->buttons() ^ e->button())) {
        e->ignore();
        return;
    }
    e->accept();
    setSliderPosition(d->valueFromPoint(e->position().toPoint()));
    // ### This isn't quite right,
    // we should be doing a hit test and only setting this if it's
    // the actual dial thingie (similar to what QSlider does), but we have no
    // subControls for QDial.
    setSliderDown(true);
}